

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_rank_function.cpp
# Opt level: O2

void __thiscall
duckdb::WindowCumeDistExecutor::EvaluateInternal
          (WindowCumeDistExecutor *this,WindowExecutorGlobalState *gstate,
          WindowExecutorLocalState *lstate,DataChunk *eval_chunk,Vector *result,idx_t count,
          idx_t row_idx)

{
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  ulong end;
  reference pvVar5;
  pointer this_00;
  idx_t peer_end;
  ulong peer_end_00;
  idx_t i;
  idx_t iVar6;
  idx_t i_1;
  WindowExecutorLocalState *this_01;
  double dVar7;
  
  pdVar1 = result->data;
  this_01 = lstate + 2;
  if (*(char *)&gstate[1].super_WindowExecutorState._vptr_WindowExecutorState == '\x01') {
    pvVar5 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)this_01,6);
    pdVar2 = pvVar5->data;
    pvVar5 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)this_01,7);
    pdVar3 = pvVar5->data;
    if (gstate[1].executor == (WindowExecutor *)0x0) {
      pvVar5 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)this_01,3);
      pdVar4 = pvVar5->data;
      for (iVar6 = 0; count != iVar6; iVar6 = iVar6 + 1) {
        end = *(ulong *)(pdVar3 + iVar6 * 8);
        peer_end_00 = *(ulong *)(pdVar4 + iVar6 * 8);
        if (end <= *(ulong *)(pdVar4 + iVar6 * 8)) {
          peer_end_00 = end;
        }
        dVar7 = CumeDist(*(idx_t *)(pdVar2 + iVar6 * 8),end,peer_end_00);
        *(double *)(pdVar1 + iVar6 * 8) = dVar7;
      }
    }
    else {
      for (iVar6 = 0; count != iVar6; iVar6 = iVar6 + 1) {
        this_00 = unique_ptr<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>,_true>
                  ::operator->((unique_ptr<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>,_true>
                                *)&gstate[1].executor);
        peer_end = WindowTokenTree::PeerEnd
                             (this_00,*(idx_t *)(pdVar2 + iVar6 * 8),*(idx_t *)(pdVar3 + iVar6 * 8),
                              row_idx + iVar6);
        dVar7 = CumeDist(*(idx_t *)(pdVar2 + iVar6 * 8),*(idx_t *)(pdVar3 + iVar6 * 8),peer_end);
        *(double *)(pdVar1 + iVar6 * 8) = dVar7;
      }
    }
  }
  else {
    pvVar5 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)this_01,0);
    pdVar2 = pvVar5->data;
    pvVar5 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)this_01,1);
    pdVar3 = pvVar5->data;
    pvVar5 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)this_01,3);
    pdVar4 = pvVar5->data;
    for (iVar6 = 0; count != iVar6; iVar6 = iVar6 + 1) {
      dVar7 = CumeDist(*(idx_t *)(pdVar2 + iVar6 * 8),*(idx_t *)(pdVar3 + iVar6 * 8),
                       *(idx_t *)(pdVar4 + iVar6 * 8));
      *(double *)(pdVar1 + iVar6 * 8) = dVar7;
    }
  }
  return;
}

Assistant:

void WindowCumeDistExecutor::EvaluateInternal(WindowExecutorGlobalState &gstate, WindowExecutorLocalState &lstate,
                                              DataChunk &eval_chunk, Vector &result, idx_t count, idx_t row_idx) const {
	auto &gpeer = gstate.Cast<WindowPeerGlobalState>();
	auto &lpeer = lstate.Cast<WindowPeerLocalState>();
	auto rdata = FlatVector::GetData<double>(result);

	if (gpeer.use_framing) {
		auto frame_begin = FlatVector::GetData<const idx_t>(lpeer.bounds.data[FRAME_BEGIN]);
		auto frame_end = FlatVector::GetData<const idx_t>(lpeer.bounds.data[FRAME_END]);
		if (gpeer.token_tree) {
			for (idx_t i = 0; i < count; ++i, ++row_idx) {
				const auto peer_end = gpeer.token_tree->PeerEnd(frame_begin[i], frame_end[i], row_idx);
				rdata[i] = CumeDist(frame_begin[i], frame_end[i], peer_end);
			}
		} else {
			auto peer_end = FlatVector::GetData<const idx_t>(lpeer.bounds.data[PEER_END]);
			for (idx_t i = 0; i < count; ++i, ++row_idx) {
				//	Clamp the peer end to the frame
				const auto frame_peer_end = MinValue(peer_end[i], frame_end[i]);
				rdata[i] = CumeDist(frame_begin[i], frame_end[i], frame_peer_end);
			}
		}
		return;
	}

	auto partition_begin = FlatVector::GetData<const idx_t>(lpeer.bounds.data[PARTITION_BEGIN]);
	auto partition_end = FlatVector::GetData<const idx_t>(lpeer.bounds.data[PARTITION_END]);
	auto peer_end = FlatVector::GetData<const idx_t>(lpeer.bounds.data[PEER_END]);
	for (idx_t i = 0; i < count; ++i, ++row_idx) {
		rdata[i] = CumeDist(partition_begin[i], partition_end[i], peer_end[i]);
	}
}